

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O1

void __thiscall gss::innards::Proof::recover_at_most_one_constraint(Proof *this,int p)

{
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var1;
  unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  uVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  long lVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  char local_19;
  
  _Var1._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  lVar5 = (long)p;
  p_Var4 = (_Base_ptr)((long)&(_Var1._M_head_impl)->at_most_one_value_constraints + 8);
  p_Var6 = p_Var4;
  for (p_Var7 = *(_Base_ptr *)((long)&(_Var1._M_head_impl)->at_most_one_value_constraints + 0x10);
      p_Var7 != (_Base_ptr)0x0;
      p_Var7 = *(_Base_ptr *)((long)&p_Var7->_M_left + (ulong)(*(long *)(p_Var7 + 1) < lVar5) * 8))
  {
    if (lVar5 <= *(long *)(p_Var7 + 1)) {
      p_Var6 = p_Var7;
    }
  }
  p_Var7 = p_Var4;
  if ((p_Var6 != p_Var4) && (p_Var7 = p_Var6, lVar5 < *(long *)(p_Var6 + 1))) {
    p_Var7 = p_Var4;
  }
  if ((p_Var7 != p_Var4) && (*(_Base_ptr *)((long)(p_Var7 + 2) + 8) == (_Base_ptr)0x0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((_Var1._M_head_impl)->proof_stream)._M_t,"# 0\n",4);
    uVar2._M_t.
    super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
    .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>._M_head_impl
         = (((this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream).
           _M_t;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               uVar2._M_t.
               super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
               _M_head_impl,"ia ",3);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)
                        uVar2._M_t.
                        super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                        ._M_head_impl,(char *)*(_Base_ptr *)((long)(p_Var7 + 1) + 8),
                        (long)*(_Base_ptr *)((long)(p_Var7 + 1) + 0x10));
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ;\n",3);
    _Var1._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
    p_Var4 = (_Base_ptr)((_Var1._M_head_impl)->proof_line + 1);
    (_Var1._M_head_impl)->proof_line = (long)p_Var4;
    *(_Base_ptr *)((long)(p_Var7 + 2) + 8) = p_Var4;
    uVar2._M_t.
    super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
    .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>._M_head_impl
         = ((_Var1._M_head_impl)->proof_stream)._M_t;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               uVar2._M_t.
               super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
               _M_head_impl,"# ",2);
    poVar3 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)
                        uVar2._M_t.
                        super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                        ._M_head_impl,
                        ((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                        active_level);
    local_19 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_19,1);
  }
  return;
}

Assistant:

auto Proof::recover_at_most_one_constraint(int p) -> void
{
    auto it = _imp->at_most_one_value_constraints.find(p);
    if (it != _imp->at_most_one_value_constraints.end() && 0 == get<1>(it->second)) {
        *_imp->proof_stream << "# 0\n";
        *_imp->proof_stream << "ia " << get<2>(it->second) << " ;\n";
        get<1>(it->second) = ++_imp->proof_line;
        *_imp->proof_stream << "# " << _imp->active_level << '\n';
    }
}